

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall
ktx::DiffComplex<KVEntryUint32>::printText
          (DiffComplex<KVEntryUint32> *this,size_t index,PrintIndent *out,char *prefix)

{
  char *in_stack_00000030;
  PrintIndent *in_stack_00000038;
  KVEntryUint32 *in_stack_00000040;
  
  std::optional<KVEntryUint32>::operator->((optional<KVEntryUint32> *)0x16f822);
  CommandCompare::compareKVEntry(ktx::PrintDiff&,std::basic_string_view<char,std::
  char_traits<char>>const&,ktxKVListEntry*,ktxKVListEntry*)::KVEntryUint32::printText(ktx::
  PrintIndent__char_const___const(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  return;
}

Assistant:

void printText(std::size_t index, PrintIndent& out, const char* prefix) const {
        values[index]->printText(out, prefix);
    }